

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

UpdateType boost::any_cast<libDAI::BP::UpdateType>(any *operand)

{
  UpdateType *pUVar1;
  
  pUVar1 = any_cast<libDAI::BP::UpdateType_const&>(operand);
  return (UpdateType)pUVar1->v;
}

Assistant:

inline ValueType any_cast(const any & operand)
    {
        typedef BOOST_DEDUCED_TYPENAME remove_reference<ValueType>::type nonref;

#ifdef BOOST_NO_TEMPLATE_PARTIAL_SPECIALIZATION
        // The comment in the above version of 'any_cast' explains when this
        // assert is fired and what to do.
        BOOST_STATIC_ASSERT(!is_reference<nonref>::value);
#endif

        return any_cast<const nonref &>(const_cast<any &>(operand));
    }